

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

void Eigen::internal::queryCacheSizes_intel_direct(int *l1,int *l2,int *l3)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  *l3 = 0;
  *l2 = 0;
  *l1 = 0;
  uVar6 = 0;
  do {
    puVar1 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    if (((uVar2 & 0xd) == 1) &&
       (((uVar5 = uVar2 >> 5 & 7, piVar4 = l1, uVar5 == 1 || (piVar4 = l3, uVar5 == 3)) ||
        (piVar4 = l2, uVar5 == 2)))) {
      *piVar4 = (puVar1[3] + 1) * ((uVar3 >> 0x16) + 1) *
                ((uVar3 & 0xfff) + 1) * ((uVar3 >> 0xc & 0x3ff) + 1);
    }
  } while (((uVar2 & 0xf) != 0) && (bVar7 = uVar6 < 0xf, uVar6 = uVar6 + 1, bVar7));
  return;
}

Assistant:

inline void queryCacheSizes_intel_direct(int& l1, int& l2, int& l3)
{
  int abcd[4];
  l1 = l2 = l3 = 0;
  int cache_id = 0;
  int cache_type = 0;
  do {
    abcd[0] = abcd[1] = abcd[2] = abcd[3] = 0;
    EIGEN_CPUID(abcd,0x4,cache_id);
    cache_type  = (abcd[0] & 0x0F) >> 0;
    if(cache_type==1||cache_type==3) // data or unified cache
    {
      int cache_level = (abcd[0] & 0xE0) >> 5;  // A[7:5]
      int ways        = (abcd[1] & 0xFFC00000) >> 22; // B[31:22]
      int partitions  = (abcd[1] & 0x003FF000) >> 12; // B[21:12]
      int line_size   = (abcd[1] & 0x00000FFF) >>  0; // B[11:0]
      int sets        = (abcd[2]);                    // C[31:0]

      int cache_size = (ways+1) * (partitions+1) * (line_size+1) * (sets+1);

      switch(cache_level)
      {
        case 1: l1 = cache_size; break;
        case 2: l2 = cache_size; break;
        case 3: l3 = cache_size; break;
        default: break;
      }
    }
    cache_id++;
  } while(cache_type>0 && cache_id<16);
}